

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPipeConnection.cxx
# Opt level: O1

bool __thiscall cmPipeConnection::OnServeStart(cmPipeConnection *this,string *errorMessage)

{
  auto_pipe_t *this_00;
  bool bVar1;
  int iVar2;
  uv_loop_t *ctx;
  uv_pipe_s *handle;
  long *plVar3;
  uv_stream_t *stream;
  undefined8 *puVar4;
  long *plVar5;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  this_00 = &this->ServerPipe;
  ctx = cmServerBase::GetLoop((this->super_cmEventBasedConnection).super_cmConnection.Server);
  auto_pipe_t::init(this_00,(EVP_PKEY_CTX *)ctx);
  handle = auto_handle_::operator_cast_to_uv_pipe_s_(&this_00->super_auto_handle_<uv_pipe_s>);
  iVar2 = uv_pipe_bind(handle,(this->PipeName)._M_dataplus._M_p);
  if (iVar2 == 0) {
    stream = auto_pipe_t::operator_cast_to_uv_stream_s_(this_00);
    iVar2 = uv_listen(stream,1,cmEventBasedConnection::on_new_connection);
    if (iVar2 == 0) {
      bVar1 = cmConnection::OnServeStart((cmConnection *)this,errorMessage);
      return bVar1;
    }
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Internal Error listening on ","");
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)local_70,(ulong)(this->PipeName)._M_dataplus._M_p);
    local_90 = &local_80;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_80 = *plVar3;
      lStack_78 = puVar4[3];
    }
    else {
      local_80 = *plVar3;
      local_90 = (long *)*puVar4;
    }
    local_88 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
    local_b0 = &local_a0;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_a0 = *plVar3;
      lStack_98 = puVar4[3];
    }
    else {
      local_a0 = *plVar3;
      local_b0 = (long *)*puVar4;
    }
    local_a8 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    uv_err_name(iVar2);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  }
  else {
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Internal Error with ","");
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_70,(ulong)(this->PipeName)._M_dataplus._M_p);
    local_90 = &local_80;
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_80 = *plVar5;
      lStack_78 = plVar3[3];
    }
    else {
      local_80 = *plVar5;
      local_90 = (long *)*plVar3;
    }
    local_88 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_b0 = &local_a0;
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_a0 = *plVar5;
      lStack_98 = plVar3[3];
    }
    else {
      local_a0 = *plVar5;
      local_b0 = (long *)*plVar3;
    }
    local_a8 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    uv_err_name(iVar2);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  }
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_40 = *plVar5;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar5;
    local_50 = (long *)*plVar3;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)errorMessage,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return false;
}

Assistant:

bool cmPipeConnection::OnServeStart(std::string* errorMessage)
{
  this->ServerPipe.init(*this->Server->GetLoop(), 0,
                        static_cast<cmEventBasedConnection*>(this));

  int r;
  if ((r = uv_pipe_bind(this->ServerPipe, this->PipeName.c_str())) != 0) {
    *errorMessage = std::string("Internal Error with ") + this->PipeName +
      ": " + uv_err_name(r);
    return false;
  }

  if ((r = uv_listen(this->ServerPipe, 1, on_new_connection)) != 0) {
    *errorMessage = std::string("Internal Error listening on ") +
      this->PipeName + ": " + uv_err_name(r);
    return false;
  }

  return cmConnection::OnServeStart(errorMessage);
}